

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_pattern.cpp
# Opt level: O1

string * __thiscall
duckdb::FilenamePattern::CreateFilename
          (string *__return_storage_ptr__,FilenamePattern *this,FileSystem *fs,string *path,
          string *extension,idx_t offset)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  long *plVar4;
  idx_t iVar5;
  size_type *psVar6;
  char cVar7;
  hugeint_t hVar8;
  hugeint_t input;
  string __str;
  string replacement;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string local_c0;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  FileSystem *local_60;
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_80 = local_70;
  pcVar1 = (this->base)._M_dataplus._M_p;
  local_60 = fs;
  local_58 = path;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (this->base)._M_string_length);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  if (this->uuid == true) {
    hVar8 = UUID::GenerateRandomUUID();
    input.lower = hVar8.upper;
    input.upper = (int64_t)path;
    BaseUUID::ToString_abi_cxx11_(&local_c0,(BaseUUID *)hVar8.lower,input);
    ::std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  else {
    cVar7 = '\x01';
    if (9 < offset) {
      iVar5 = offset;
      cVar3 = '\x04';
      do {
        cVar7 = cVar3;
        if (iVar5 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_00e7241f;
        }
        if (iVar5 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_00e7241f;
        }
        if (iVar5 < 10000) goto LAB_00e7241f;
        bVar2 = 99999 < iVar5;
        iVar5 = iVar5 / 10000;
        cVar3 = cVar7 + '\x04';
      } while (bVar2);
      cVar7 = cVar7 + '\x01';
    }
LAB_00e7241f:
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_c0,cVar7);
    ::std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,offset);
    ::std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  ::std::__cxx11::string::replace((ulong)&local_80,this->pos,(char *)0x0,(ulong)local_a0);
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_50,local_80,local_80 + local_78);
  ::std::__cxx11::string::append((char *)local_50);
  plVar4 = (long *)::std::__cxx11::string::_M_append
                             ((char *)local_50,(ulong)(extension->_M_dataplus)._M_p);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_c0.field_2._M_allocated_capacity = *psVar6;
    local_c0.field_2._8_8_ = plVar4[3];
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar6;
    local_c0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_c0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  FileSystem::JoinPath(__return_storage_ptr__,local_60,local_58,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

string FilenamePattern::CreateFilename(FileSystem &fs, const string &path, const string &extension,
                                       idx_t offset) const {
	string result(base);
	string replacement;

	if (uuid) {
		replacement = UUID::ToString(UUID::GenerateRandomUUID());
	} else {
		replacement = std::to_string(offset);
	}
	result.insert(pos, replacement);
	return fs.JoinPath(path, result + "." + extension);
}